

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O2

aiScene * __thiscall
Assimp::BaseImporter::ReadFile(BaseImporter *this,Importer *pImp,string *pFile,IOSystem *pIOHandler)

{
  ProgressHandler *pPVar1;
  aiScene *this_00;
  _Head_base<0UL,_aiScene_*,_false> _Var2;
  unique_ptr<aiScene,_std::default_delete<aiScene>_> sc;
  FileSystemFilter filter;
  _Head_base<0UL,_aiScene_*,_false> local_98;
  FileSystemFilter local_90;
  
  pPVar1 = Importer::GetProgressHandler(pImp);
  this->m_progress = pPVar1;
  if (pPVar1 == (ProgressHandler *)0x0) {
    _Var2._M_head_impl = (aiScene *)0x0;
  }
  else {
    (*this->_vptr_BaseImporter[4])(this,pImp);
    FileSystemFilter::FileSystemFilter(&local_90,pFile,pIOHandler);
    this_00 = (aiScene *)operator_new(0x80);
    aiScene::aiScene(this_00);
    local_98._M_head_impl = this_00;
    (*this->_vptr_BaseImporter[10])(this,pFile,this_00,&local_90);
    (**this->_vptr_BaseImporter)(this,pImp);
    _Var2._M_head_impl = local_98._M_head_impl;
    local_98._M_head_impl = (aiScene *)0x0;
    std::unique_ptr<aiScene,_std::default_delete<aiScene>_>::~unique_ptr
              ((unique_ptr<aiScene,_std::default_delete<aiScene>_> *)&local_98);
    FileSystemFilter::~FileSystemFilter(&local_90);
  }
  return _Var2._M_head_impl;
}

Assistant:

aiScene* BaseImporter::ReadFile(Importer* pImp, const std::string& pFile, IOSystem* pIOHandler) {


    m_progress = pImp->GetProgressHandler();
    if (nullptr == m_progress) {
        return nullptr;
    }

    ai_assert(m_progress);

    // Gather configuration properties for this run
    SetupProperties( pImp );

    // Construct a file system filter to improve our success ratio at reading external files
    FileSystemFilter filter(pFile,pIOHandler);

    // create a scene object to hold the data
    std::unique_ptr<aiScene> sc(new aiScene());

    // dispatch importing
    try
    {
        InternReadFile( pFile, sc.get(), &filter);

        // Calculate import scale hook - required because pImp not available anywhere else
        // passes scale into ScaleProcess
        UpdateImporterScale(pImp);


    } catch( const std::exception& err )    {
        // extract error description
        m_ErrorText = err.what();
        ASSIMP_LOG_ERROR(m_ErrorText);
        return nullptr;
    }

    // return what we gathered from the import.
    return sc.release();
}